

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O2

void __thiscall
WordSplitStringTest_random_vector_Test<char32_t>::TestBody
          (WordSplitStringTest_random_vector_Test<char32_t> *this)

{
  char *pcVar1;
  AssertHelper local_b0 [8];
  long *local_a8;
  AssertionResult gtest_ar;
  vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  split_result;
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_> data;
  
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
  RandomWordTestData(&data,L'\0',0,0);
  jessilib::
  word_split<std::vector,_std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
            (&split_result,&data.m_str,L'\0');
  testing::internal::
  CmpHelperEQ<std::vector<std::vector<char32_t,std::allocator<char32_t>>,std::allocator<std::vector<char32_t,std::allocator<char32_t>>>>,std::vector<std::vector<char32_t,std::allocator<char32_t>>,std::allocator<std::vector<char32_t,std::allocator<char32_t>>>>>
            ((internal *)&gtest_ar,"split_result","data.m_tokens",&split_result,&data.m_tokens);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xf7,pcVar1);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_a8 != (long *)0x0) {
      (**(code **)(*local_a8 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ::~vector(&split_result);
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
  ~RandomWordTestData(&data);
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_vector) {
	RandomWordTestData<TypeParam, std::vector<TypeParam>> data{};
	std::vector<std::vector<TypeParam>> split_result = word_split<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}